

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.h
# Opt level: O0

Rectangle<int> __thiscall Rml::Rectangle<int>::Intersect(Rectangle<int> *this,Rectangle<int> other)

{
  code *pcVar1;
  Rectangle<int> RVar2;
  bool bVar3;
  Vector2i VVar4;
  Vector2i VVar5;
  Rectangle<int> *this_local;
  Rectangle<int> other_local;
  Rectangle<int> result;
  
  other_local.p0 = other.p1;
  this_local = (Rectangle<int> *)other.p0;
  bVar3 = Valid(this);
  if (((!bVar3) || (bVar3 = Valid((Rectangle<int> *)&this_local), !bVar3)) &&
     (bVar3 = Assert("RMLUI_ASSERT(Valid() && other.Valid())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Rectangle.h"
                     ,0x51), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  VVar4.x = (this->p0).x;
  VVar4.y = (this->p0).y;
  VVar4 = Math::Max<Rml::Vector2<int>>(VVar4,(Vector2i)this_local);
  VVar5.x = (this->p1).x;
  VVar5.y = (this->p1).y;
  VVar5 = Math::Min<Rml::Vector2<int>>(VVar5,other_local.p0);
  Rectangle((Rectangle<int> *)&other_local.p1,VVar4,VVar5);
  VVar4 = Math::Max<Rml::Vector2<int>>(other_local.p1,result.p0);
  RVar2.p1.x = VVar4.x;
  RVar2.p1.y = VVar4.y;
  RVar2.p0 = other_local.p1;
  return RVar2;
}

Assistant:

Rectangle Intersect(Rectangle other) const
	{
		RMLUI_ASSERT(Valid() && other.Valid());
		Rectangle result{Math::Max(p0, other.p0), Math::Min(p1, other.p1)};
		result.p1 = Math::Max(result.p0, result.p1);
		return result;
	}